

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

void SHMRemoveNamedObject(SHMPTR shmNamedObject)

{
  SHMPTR shmptr;
  LPVOID pvVar1;
  PSHM_NAMED_OBJECTS local_20;
  PSHM_NAMED_OBJECTS pshmCurrent;
  PSHM_NAMED_OBJECTS pshmLast;
  SHMPTR shmNamedObject_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  SHMLock();
  shmptr = SHMGetInfo(SIID_NAMED_OBJECTS);
  local_20 = (PSHM_NAMED_OBJECTS)SHMPtrToPtr(shmptr);
  pshmCurrent = local_20;
  do {
    if (local_20 == (PSHM_NAMED_OBJECTS)0x0) {
LAB_0015c803:
      SHMRelease();
      return;
    }
    if (local_20->ShmSelf == shmNamedObject) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if (pshmCurrent->ShmSelf == local_20->ShmSelf) {
        SHMSetInfo(SIID_NAMED_OBJECTS,local_20->ShmNext);
      }
      else {
        pvVar1 = SHMPtrToPtr(local_20->ShmNext);
        if (pvVar1 == (LPVOID)0x0) {
          pshmCurrent->ShmNext = 0;
        }
        else {
          pshmCurrent->ShmNext = local_20->ShmNext;
        }
      }
      goto LAB_0015c803;
    }
    pshmCurrent = local_20;
    local_20 = (PSHM_NAMED_OBJECTS)SHMPtrToPtr(local_20->ShmNext);
  } while( true );
}

Assistant:

void SHMRemoveNamedObject( SHMPTR shmNamedObject )
{
    PSHM_NAMED_OBJECTS pshmLast = 0;
    PSHM_NAMED_OBJECTS pshmCurrent = 0;

    TRACE( "Entered SHMDeleteNamedObject shmNamedObject = %d\n", shmNamedObject );
    SHMLock();

    pshmCurrent =
        (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( SHMGetInfo( SIID_NAMED_OBJECTS ) );
    pshmLast = pshmCurrent;

    while ( pshmCurrent )
    {
        if ( pshmCurrent->ShmSelf == shmNamedObject )
        {
            TRACE( "Patching the list.\n" );

            /* Patch the list, and delete the object. */
            if ( pshmLast->ShmSelf == pshmCurrent->ShmSelf )
            {
                /* Either the first element or no elements left. */
                SHMSetInfo( SIID_NAMED_OBJECTS, pshmCurrent->ShmNext );
            }
            else if ( (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( pshmCurrent->ShmNext ) )
            {
                pshmLast->ShmNext = pshmCurrent->ShmNext;
            }
            else
            {
                /* Only one left. */
                pshmLast->ShmNext = 0;
            }

            break;
        }
        else
        {
            pshmLast = pshmCurrent;
            pshmCurrent = (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( pshmCurrent->ShmNext );
        }
    }

    SHMRelease();
    return;
}